

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

size_t __thiscall
PClassActor::PointerSubstitution(PClassActor *this,DObject *oldclass,DObject *newclass)

{
  uint uVar1;
  PClassPlayerPawn **ppPVar2;
  uint local_2c;
  size_t sStack_28;
  uint i;
  size_t changed;
  DObject *newclass_local;
  DObject *oldclass_local;
  PClassActor *this_local;
  
  sStack_28 = DObject::PointerSubstitution((DObject *)this,oldclass,newclass);
  local_2c = 0;
  while( true ) {
    uVar1 = TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::Size(&this->VisibleToPlayerClass);
    if (uVar1 <= local_2c) break;
    ppPVar2 = TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::operator[]
                        (&this->VisibleToPlayerClass,(ulong)local_2c);
    if (*ppPVar2 == (PClassPlayerPawn *)oldclass) {
      ppPVar2 = TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::operator[]
                          (&this->VisibleToPlayerClass,(ulong)local_2c);
      *ppPVar2 = (PClassPlayerPawn *)newclass;
      sStack_28 = sStack_28 + 1;
    }
    local_2c = local_2c + 1;
  }
  return sStack_28;
}

Assistant:

size_t PClassActor::PointerSubstitution(DObject *oldclass, DObject *newclass)
{
	auto changed = Super::PointerSubstitution(oldclass, newclass);
	for (unsigned i = 0; i < VisibleToPlayerClass.Size(); i++)
	{
		if (VisibleToPlayerClass[i] == oldclass)
		{
			VisibleToPlayerClass[i] = static_cast<PClassPlayerPawn*>(newclass);
			changed++;
		}
	}
	return changed;
}